

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::UKF(UKF *this)

{
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  int local_6c;
  Matrix<double,__1,__1,_0,__1,__1> local_68;
  int local_50 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_48;
  Matrix<double,__1,_1,_0,__1,_1> local_30 [2];
  UKF *local_10;
  UKF *this_local;
  
  this->_vptr_UKF = (_func_int **)&PTR__UKF_00169d38;
  local_10 = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Xsig_pred_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->weights_);
  this->use_laser_ = true;
  this->use_radar_ = true;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(local_30,5);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->x_,local_30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_30);
  local_50[1] = 5;
  local_50[0] = 5;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_48,local_50 + 1,local_50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->P_,&local_48);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_48);
  this->std_a_ = 2.0;
  this->std_yawdd_ = 0.3;
  this->std_laspx_ = 0.15;
  this->std_laspy_ = 0.15;
  this->std_radr_ = 0.3;
  this->std_radphi_ = 0.03;
  this->std_radrd_ = 0.3;
  this->is_initialized_ = false;
  this->time_us_ = 0;
  this->n_x_ = 5;
  this->n_aug_ = 7;
  this->lambda_ = (double)(3 - this->n_x_);
  local_6c = this->n_aug_ * 2 + 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_68,&this->n_x_,&local_6c);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->Xsig_pred_,&local_68);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_68);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_80,(long)(this->n_aug_ * 2 + 1));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->weights_,&local_80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_80);
  this->NIS_radar_ = 0.0;
  this->NIS_laser_ = 0.0;
  return;
}

Assistant:

UKF::UKF() {
  // if this is false, laser measurements will be ignored (except during init)
  use_laser_ = true;

  // if this is false, radar measurements will be ignored (except during init)
  use_radar_ = true;

  // initial state vector
  x_ = VectorXd(5);

  // initial covariance matrix
  P_ = MatrixXd(5, 5);

  // Process noise standard deviation longitudinal acceleration in m/s^2
  std_a_ = 2;

  // Process noise standard deviation yaw acceleration in rad/s^2
  std_yawdd_ = 0.3;

  // Laser measurement noise standard deviation position1 in m
  std_laspx_ = 0.15;

  // Laser measurement noise standard deviation position2 in m
  std_laspy_ = 0.15;

  // Radar measurement noise standard deviation radius in m
  std_radr_ = 0.3;

  // Radar measurement noise standard deviation angle in rad
  std_radphi_ = 0.03;

  // Radar measurement noise standard deviation radius change in m/s
  std_radrd_ = 0.3;

  /**
  TODO:
  Complete the initialization. See ukf.h for other member properties.
  Hint: one or more values initialized above might be wildly off...
  */

  // initially set to false, set to true in first call of ProcessMeasurement
  is_initialized_ = false;

  // time when the state is true, in us
  time_us_ = 0.0;

  // state dimension
  n_x_ = 5;

  // Augmented state dimension
  n_aug_ = 7;

  // Sigma point spreading parameter
  lambda_ = 3 - n_x_;

  // predicted sigma points matrix
  Xsig_pred_ = MatrixXd(n_x_, 2 * n_aug_ + 1);

  //create vector for weights
  weights_ = VectorXd(2 * n_aug_ + 1);

  // the current NIS for radar
  NIS_radar_ = 0.0;

  // the current NIS for laser
  NIS_laser_ = 0.0;
}